

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O0

int linenoiseHistorySave(char *filename)

{
  char *in_RDI;
  int j;
  File file;
  mode_t old_umask;
  File *this;
  int local_64;
  allocator<char> local_49;
  string local_48 [8];
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  File local_28;
  __mode_t local_14;
  char *local_10;
  int local_4;
  
  local_10 = in_RDI;
  local_14 = umask(0x7f);
  File::File(&local_28);
  this = (File *)&local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  File::open(&local_28,(char *)local_48,0x30ef69);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  umask(local_14);
  if ((FILE *)local_28.file == (FILE *)0x0) {
    local_4 = -1;
  }
  else {
    chmod(local_10,0x180);
    for (local_64 = 0; local_64 < history_len; local_64 = local_64 + 1) {
      fprintf((FILE *)local_28.file,"%s\n",history[local_64]);
    }
    local_4 = 0;
  }
  File::~File(this);
  return local_4;
}

Assistant:

int linenoiseHistorySave(const char *filename) {
    mode_t old_umask = umask(S_IXUSR|S_IRWXG|S_IRWXO);
    File   file;
    file.open(filename, "w");
    umask(old_umask);
    if (file.file == NULL) {
        return -1;
    }
    chmod(filename,S_IRUSR|S_IWUSR);
    for (int j = 0; j < history_len; ++j) {
        fprintf(file.file, "%s\n", history[j]);
    }

    return 0;
}